

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O0

void __thiscall pbrt::MLTSampler::EnsureReady(MLTSampler *this,int index)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  reference this_00;
  int in_ESI;
  long in_RDI;
  float fVar5;
  Float FVar6;
  double dVar7;
  undefined1 auVar8 [16];
  Float effSigma;
  Float normalSample;
  int64_t nSmall;
  PrimarySample *Xi;
  Float in_stack_ffffffffffffffbc;
  Float in_stack_ffffffffffffffc0;
  Float in_stack_ffffffffffffffc4;
  size_type in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar3 = (ulong)in_ESI;
  sVar4 = pstd::
          vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
          ::size((vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
                  *)(in_RDI + 0x28));
  if (sVar4 <= uVar3) {
    pstd::
    vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
    ::resize((vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
              *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
  }
  this_00 = pstd::
            vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
            ::operator[]((vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
                          *)(in_RDI + 0x28),(long)in_ESI);
  if (this_00->lastModificationIteration < *(long *)(in_RDI + 0x58)) {
    fVar5 = RNG::Uniform<float>((RNG *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                               );
    this_00->value = fVar5;
    this_00->lastModificationIteration = *(int64_t *)(in_RDI + 0x58);
  }
  PrimarySample::Backup(this_00);
  if ((*(byte *)(in_RDI + 0x50) & 1) == 0) {
    lVar1 = *(long *)(in_RDI + 0x48);
    lVar2 = this_00->lastModificationIteration;
    RNG::Uniform<float>((RNG *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    FVar6 = SampleNormal(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                         in_stack_ffffffffffffffbc);
    fVar5 = *(float *)(in_RDI + 0x18);
    auVar8._0_4_ = (float)(lVar1 - lVar2);
    auVar8._4_12_ = SUB6012((undefined1  [60])0x0,0);
    dVar7 = std::sqrt(auVar8._0_8_);
    auVar8 = vfmadd213ss_fma(ZEXT416((uint)(fVar5 * SUB84(dVar7,0))),ZEXT416((uint)FVar6),
                             ZEXT416((uint)this_00->value));
    this_00->value = auVar8._0_4_;
    dVar7 = std::floor((double)(ulong)(uint)this_00->value);
    this_00->value = this_00->value - SUB84(dVar7,0);
  }
  else {
    fVar5 = RNG::Uniform<float>((RNG *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                               );
    this_00->value = fVar5;
  }
  this_00->lastModificationIteration = *(int64_t *)(in_RDI + 0x48);
  return;
}

Assistant:

void MLTSampler::EnsureReady(int index) {
#ifdef PBRT_IS_GPU_CODE
    LOG_FATAL("MLTSampler not supported on GPU--needs vector resize...");
    return;
#else
    // Enlarge _MLTSampler::X_ if necessary and get current $\VEC{X}_i$
    if (index >= X.size())
        X.resize(index + 1);
    PrimarySample &Xi = X[index];

    // Reset $\VEC{X}_i$ if a large step took place in the meantime
    if (Xi.lastModificationIteration < lastLargeStepIteration) {
        Xi.value = rng.Uniform<Float>();
        Xi.lastModificationIteration = lastLargeStepIteration;
    }

    // Apply remaining sequence of mutations to _sample_
    Xi.Backup();
    if (largeStep) {
        Xi.value = rng.Uniform<Float>();
    } else {
        int64_t nSmall = currentIteration - Xi.lastModificationIteration;
        // Apply _nSmall_ small step mutations
        // Sample the standard normal distribution $N(0, 1)$
        Float normalSample = SampleNormal(rng.Uniform<Float>());

        // Compute the effective standard deviation and apply perturbation to $\VEC{X}_i$
        Float effSigma = sigma * std::sqrt((Float)nSmall);
        Xi.value += normalSample * effSigma;
        Xi.value -= std::floor(Xi.value);
    }
    Xi.lastModificationIteration = currentIteration;

#endif
}